

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

ReshapeDynamicLayerParams * __thiscall
CoreML::Specification::ReshapeDynamicLayerParams::New(ReshapeDynamicLayerParams *this,Arena *arena)

{
  ReshapeDynamicLayerParams *this_00;
  
  this_00 = (ReshapeDynamicLayerParams *)operator_new(0x18);
  ReshapeDynamicLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::ReshapeDynamicLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

ReshapeDynamicLayerParams* ReshapeDynamicLayerParams::New(::google::protobuf::Arena* arena) const {
  ReshapeDynamicLayerParams* n = new ReshapeDynamicLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}